

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::clear
          (SmallVectorBase<slang::analysis::DataFlowState> *this)

{
  pointer p;
  pointer pDVar1;
  pointer pDVar2;
  
  if (this->len != 0) {
    pDVar1 = this->data_;
    pDVar2 = pDVar1 + this->len;
    do {
      p = (pDVar1->assigned).
          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_;
      if (p != (pointer)(pDVar1->assigned).
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .firstElement) {
        operator_delete(p);
      }
      pDVar1 = pDVar1 + 1;
    } while (pDVar1 != pDVar2);
  }
  this->len = 0;
  return;
}

Assistant:

void clear() noexcept {
        std::ranges::destroy(*this);
        len = 0;
    }